

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O0

void __thiscall CConfigManager::Init(CConfigManager *this,int FlagMask)

{
  IStorage *pIVar1;
  IConsole *pIVar2;
  undefined4 in_ESI;
  IInterface *in_RDI;
  IKernel *in_stack_ffffffffffffffe0;
  
  IInterface::Kernel(in_RDI);
  pIVar1 = IKernel::RequestInterface<IStorage>(in_stack_ffffffffffffffe0);
  in_RDI[1]._vptr_IInterface = (_func_int **)pIVar1;
  IInterface::Kernel(in_RDI);
  pIVar2 = IKernel::RequestInterface<IConsole>(in_stack_ffffffffffffffe0);
  in_RDI[1].m_pKernel = (IKernel *)pIVar2;
  *(undefined4 *)&in_RDI[2].m_pKernel = in_ESI;
  (*in_RDI->_vptr_IInterface[3])();
  if (in_RDI[1].m_pKernel != (IKernel *)0x0) {
    (*(in_RDI[1].m_pKernel)->_vptr_IKernel[8])
              (in_RDI[1].m_pKernel,"save_config","?s[file]",0xe,Con_SaveConfig,in_RDI,
               "Save config to file");
  }
  return;
}

Assistant:

void CConfigManager::Init(int FlagMask)
{
	m_pStorage = Kernel()->RequestInterface<IStorage>();
	m_pConsole = Kernel()->RequestInterface<IConsole>();
	m_FlagMask = FlagMask;
	Reset();

	if(m_pConsole)
		m_pConsole->Register("save_config", "?s[file]", CFGFLAG_SERVER|CFGFLAG_CLIENT|CFGFLAG_STORE, Con_SaveConfig, this, "Save config to file");
}